

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O3

void __thiscall
dd::ProcessThreadImpl::RegisterModule(ProcessThreadImpl *this,Module *module,Location *from)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  bool bVar5;
  _List_node_base *p_Var6;
  
  bVar5 = SequenceCheckerImpl::IsCurrent((SequenceCheckerImpl *)&this->_thread_checker);
  if (bVar5) {
    if ((this->_thread)._M_t.
        super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
        super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
        super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl != (PlatformThread *)0x0) {
      (*module->_vptr_Module[2])(module,this);
    }
    pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
    p_Var2 = *(_List_node_base **)&from->_line_number;
    p_Var3 = (_List_node_base *)from->_function_name;
    p_Var4 = (_List_node_base *)from->_file_name;
    p_Var6 = (_List_node_base *)operator_new(0x38);
    p_Var6[1]._M_next = (_List_node_base *)module;
    p_Var6[1]._M_prev = (_List_node_base *)0x0;
    p_Var6[2]._M_next = p_Var3;
    p_Var6[2]._M_prev = p_Var4;
    p_Var6[3]._M_next = p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(this->_modules).
              super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
    Event::Set(&this->_wake_up);
    return;
  }
  __assert_fail("_thread_checker.IsCurrent()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                ,0x6c,
                "virtual void dd::ProcessThreadImpl::RegisterModule(Module *, const Location &)");
}

Assistant:

void ProcessThreadImpl::RegisterModule(Module* module, const Location& from) {
		assert(_thread_checker.IsCurrent());
		if (_thread.get())
			module->ProcessThreadAttached(this);
		{
			AutoLock l(_lock);
			_modules.push_back(ModuleCallback(module, from));
		}
		_wake_up.Set();
	}